

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandExact(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  int nMaxDepth;
  uint fVerbose;
  int iVar9;
  undefined4 extraout_var;
  long lVar10;
  word wVar11;
  Gia_Man_t *pNew;
  Abc_Ntk_t *pNtk;
  uint uVar12;
  char *pcVar13;
  word *pwVar14;
  long lVar15;
  ulong uVar16;
  int r;
  uint uVar17;
  int *pArrTimeProfile_00;
  ulong uVar18;
  char *pcVar19;
  word *pwVar20;
  uint local_28c;
  int local_288;
  undefined8 local_268;
  int pArrTimeProfile [8];
  word pTruth [64];
  
  bVar6 = false;
  Extra_UtilGetoptReset();
  nMaxDepth = -1;
  local_28c = 400000;
  fVerbose = 0;
  local_288 = 0;
  bVar4 = false;
  local_268 = 1;
  bVar5 = false;
LAB_0021fd8c:
  while (iVar8 = Extra_UtilGetopt(argc,argv,"DASCatvh"), iVar9 = globalUtilOptind, iVar8 == 0x44) {
    if (argc <= globalUtilOptind) {
      pcVar13 = "Command line switch \"-D\" should be followed by an integer.\n";
      goto LAB_0021ff1c;
    }
    nMaxDepth = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar9 + 1;
    if (nMaxDepth < 0) goto LAB_0021ff26;
  }
  if (iVar8 == -1) {
    if (bVar6) {
      puts("run test suite, ignore all other settings");
      Abc_ExactTest(fVerbose);
      Abc_ExactStoreTest(fVerbose);
      return 0;
    }
    if (globalUtilOptind != argc) {
      memset(pTruth,0,0x200);
      lVar10 = 0;
LAB_0022006c:
      iVar8 = local_288;
      pwVar20 = pTruth + lVar10 * 4 + -1;
      do {
        if (argc <= iVar9) {
          pArrTimeProfile_00 = pArrTimeProfile;
          if (!bVar5) {
            pArrTimeProfile_00 = (int *)0x0;
          }
          iVar9 = (int)local_268 + -1;
          if (bVar4) {
            pNew = Gia_ManFindExact(pTruth,iVar8,(int)lVar10,nMaxDepth,pArrTimeProfile_00,local_28c,
                                    iVar9,fVerbose);
            if (pNew != (Gia_Man_t *)0x0) {
              Abc_FrameUpdateGia(pAbc,pNew);
              return 0;
            }
            pcVar13 = 
            "Could not find AIG within given resource constraints, retry with different value for -C.\n"
            ;
          }
          else {
            pNtk = Abc_NtkFindExact(pTruth,iVar8,(int)lVar10,nMaxDepth,pArrTimeProfile_00,local_28c,
                                    iVar9,fVerbose);
            if (pNtk != (Abc_Ntk_t *)0x0) {
              Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
              Abc_FrameClearVerifStatus(pAbc);
              return 0;
            }
            pcVar13 = 
            "Could not find network within given resource constraints, retry with different value for -C.\n"
            ;
          }
          Abc_Print(0,pcVar13);
          return 0;
        }
        if (lVar10 == 0x10) {
          pcVar13 = "Too many functions (at most 16 supported).\n";
          goto LAB_0021ff1c;
        }
        globalUtilOptind = iVar9 + 1;
        pcVar13 = argv[iVar9];
        if (*pcVar13 == '0') {
          pcVar13 = pcVar13 + (ulong)(pcVar13[1] == 'x') * 2;
        }
        pwVar14 = pTruth + lVar10 * 4;
        lVar15 = -0x100000000;
        uVar12 = 0xfffffffe;
        uVar16 = 0xffffffffffffffff;
        do {
          do {
            lVar7 = uVar16 + 1;
            uVar16 = uVar16 + 1;
            uVar12 = uVar12 + 1;
            lVar15 = lVar15 + 0x100000000;
          } while (0xf5 < (byte)(pcVar13[lVar7] - 0x3aU));
        } while (0xf9 < (byte)((pcVar13[lVar7] & 0xdfU) + 0xb9));
        if ((int)uVar16 == 1) {
          cVar1 = *pcVar13;
          if (cVar1 != 'F') {
            if ((cVar1 == '5') || (cVar1 == 'A')) {
              wVar11 = 0xaaaaaaaaaaaaaaaa;
              if (cVar1 == '5') {
                wVar11 = 0x5555555555555555;
              }
              local_288 = 1;
              goto LAB_00220257;
            }
            local_288 = 2;
            uVar18 = 1;
            if (cVar1 != '0') goto LAB_00220176;
          }
          wVar11 = -(ulong)(cVar1 != '0');
          local_288 = 0;
LAB_00220257:
          *pwVar14 = wVar11;
        }
        else {
          if ((int)uVar16 == 0) {
            uVar17 = 0;
          }
          else {
            uVar17 = 0;
            for (; uVar12 != 0; uVar12 = uVar12 >> 1) {
              uVar17 = uVar17 + 1;
            }
          }
          local_288 = uVar17 + 2;
          uVar18 = (ulong)(uint)(1 << ((char)uVar17 - 4U & 0x1f));
          if (uVar17 < 5) {
            uVar18 = 1;
          }
LAB_00220176:
          for (; 0 < (int)uVar18; uVar18 = uVar18 - 1) {
            pwVar20[uVar18] = 0;
          }
          for (uVar18 = 0; uVar18 != (uVar16 & 0xffffffff); uVar18 = uVar18 + 1) {
            bVar2 = pcVar13[~uVar18 + (lVar15 >> 0x20)];
            if ((byte)(bVar2 - 0x30) < 10) {
              iVar9 = -0x30;
            }
            else if ((byte)(bVar2 + 0xbf) < 6) {
              iVar9 = -0x37;
            }
            else {
              iVar9 = -0x57;
              if (5 < (byte)(bVar2 + 0x9f)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                              ,0x3c8,"int Abc_TtReadHexDigit(char)");
              }
            }
            pwVar14[uVar18 >> 4 & 0xfffffff] =
                 pwVar14[uVar18 >> 4 & 0xfffffff] |
                 (ulong)(iVar9 + (uint)bVar2) << ((char)uVar18 * '\x04' & 0x3fU);
          }
          if (local_288 < 6) {
            wVar11 = Abc_Tt6Stretch(*pwVar14,local_288);
            goto LAB_00220257;
          }
        }
        lVar10 = lVar10 + 1;
        iVar9 = globalUtilOptind;
        if (iVar8 == 0) goto LAB_0022006c;
        if (8 < iVar8) {
          pcVar13 = "Only 8-variable functions are supported.\n";
          goto LAB_0021ff1c;
        }
        pwVar20 = pwVar20 + 4;
        if (iVar8 != local_288) {
          pcVar13 = "All functions need to have the same size.\n";
          goto LAB_0021ff1c;
        }
      } while( true );
    }
    goto LAB_0021ff26;
  }
  if (iVar8 == 0x41) {
    lVar10 = (long)globalUtilOptind;
    if (globalUtilOptind < argc) {
      globalUtilOptind = globalUtilOptind + 1;
      pcVar13 = argv[lVar10];
      pcVar19 = argv[lVar10];
      iVar9 = local_288;
      while( true ) {
        pcVar3 = pcVar13;
        pcVar13 = pcVar3 + 1;
        if (*pcVar3 == '\0') break;
        if (*pcVar3 == ',') {
          *pcVar3 = '\0';
          iVar8 = atoi(pcVar19);
          pArrTimeProfile[iVar9] = iVar8;
          *pcVar3 = ',';
          pcVar19 = pcVar13;
          iVar9 = iVar9 + 1;
        }
      }
      iVar8 = atoi(pcVar19);
      local_288 = iVar9 + 1;
      pArrTimeProfile[iVar9] = iVar8;
      bVar5 = true;
      goto LAB_0021fd8c;
    }
    pcVar13 = "Command line switch \"-A\" should be followed by an integer.\n";
LAB_0021ff1c:
    Abc_Print(-1,pcVar13);
  }
  else {
    if (iVar8 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar13 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_0021ff1c;
      }
      local_28c = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar9 + 1;
      goto LAB_0021fd8c;
    }
    if (iVar8 != 0x53) {
      if (iVar8 == 0x61) {
        bVar4 = (bool)(bVar4 ^ 1);
      }
      else if (iVar8 == 0x74) {
        bVar6 = (bool)(bVar6 ^ 1);
      }
      else {
        if (iVar8 != 0x76) goto LAB_0021ff26;
        fVerbose = fVerbose ^ 1;
      }
      goto LAB_0021fd8c;
    }
    if (argc <= globalUtilOptind) {
      pcVar13 = "Command line switch \"-S\" should be followed by an integer.\n";
      goto LAB_0021ff1c;
    }
    iVar8 = atoi(argv[globalUtilOptind]);
    local_268 = CONCAT44(extraout_var,iVar8);
    globalUtilOptind = iVar9 + 1;
    if (0 < iVar8) goto LAB_0021fd8c;
  }
LAB_0021ff26:
  Abc_Print(-2,"usage: exact [-DSC <num>] [-A <list>] [-atvh] <truth1> <truth2> ...\n");
  Abc_Print(-2,
            "\t           finds optimum networks using SAT-based exact synthesis for hex truth tables <truth1> <truth2> ...\n"
           );
  Abc_Print(-2,"\t-D <num>  : constrain maximum depth (if too low, algorithm may not terminate)\n");
  Abc_Print(-2,"\t-A <list> : input arrival times (comma separated list)\n");
  Abc_Print(-2,"\t-S <num>  : number of start gates in search [default = %d]\n",local_268);
  Abc_Print(-2,
            "\t-C <num>  : the limit on the number of conflicts; turn off with 0 [default = %d]\n",
            (ulong)local_28c);
  pcVar19 = "yes";
  pcVar13 = "yes";
  if (!bVar4) {
    pcVar13 = "no";
  }
  Abc_Print(-2,"\t-a        : toggle create AIG [default = %s]\n",pcVar13);
  Abc_Print(-2,"\t-t        : run test suite\n");
  if (fVerbose == 0) {
    pcVar19 = "no";
  }
  Abc_Print(-2,"\t-v        : toggle verbose printout [default = %s]\n",pcVar19);
  Abc_Print(-2,"\t-h        : print the command usage\n");
  Abc_Print(-2,"\t\n");
  Abc_Print(-2,
            "\t            This command was contributed by Mathias Soeken from EPFL in July 2016.\n"
           );
  Abc_Print(-2,"\t            The author can be contacted as mathias.soeken at epfl.ch\n");
  return 1;
}

Assistant:

int Abc_CommandExact( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManFindExact( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrivalTimes, int nBTLimit, int nStartGates, int fVerbose );

    int c, nMaxDepth = -1, fMakeAIG = 0, fTest = 0, fVerbose = 0, nVars = 0, nVarsTmp, nFunc = 0, nStartGates = 1, nBTLimit = 400000;
    char * p1, * p2;
    word pTruth[64];
    int pArrTimeProfile[8], fHasArrTimeProfile = 0;
    Abc_Ntk_t * pNtkRes;
    Gia_Man_t * pGiaRes;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "DASCatvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nMaxDepth = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nMaxDepth < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            fHasArrTimeProfile = 1;
            p1 = p2 = argv[globalUtilOptind++];
            while ( true ) {
                if ( *p2 == ',' )
                {
                    *p2 = '\0';
                    pArrTimeProfile[nVars++] = atoi( p1 );
                    *p2++ = ',';
                    p1 = p2;
                }
                else if ( *p2 == '\0' )
                {
                    pArrTimeProfile[nVars++] = atoi( p1 );
                    break;
                }
                else
                    ++p2;
            }
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nStartGates = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nStartGates < 1 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'a':
            fMakeAIG ^= 1;
            break;
        case 't':
            fTest ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( fTest )
    {
        extern void Abc_ExactTest( int fVerbose );
        extern void Abc_ExactStoreTest( int fVerbose );

        printf( "run test suite, ignore all other settings\n" );
        Abc_ExactTest( fVerbose );
        Abc_ExactStoreTest( fVerbose );
        return 0;
    }

    if ( argc == globalUtilOptind )
        goto usage;

    memset( pTruth, 0, 64 * sizeof(word) );
    while ( globalUtilOptind < argc )
    {
        if ( nFunc == 16 )
        {
            Abc_Print( -1, "Too many functions (at most 16 supported).\n" );
            goto usage;
        }
        nVarsTmp = Abc_TtReadHex( &pTruth[nFunc << 2], argv[globalUtilOptind++] );
        nFunc++;
        if ( nVars == 0 )
            nVars = nVarsTmp;
        else if ( nVars > 8 )
        {
            Abc_Print( -1, "Only 8-variable functions are supported.\n" );
            goto usage;
        }
        else if ( nVars != nVarsTmp )
        {
            Abc_Print( -1, "All functions need to have the same size.\n" );
            goto usage;
        }
    }

    if ( fMakeAIG )
    {
        pGiaRes = Gia_ManFindExact( pTruth, nVars, nFunc, nMaxDepth, fHasArrTimeProfile ? pArrTimeProfile : NULL, nBTLimit, nStartGates - 1, fVerbose );
        if ( pGiaRes )
            Abc_FrameUpdateGia( pAbc, pGiaRes );
        else
            Abc_Print( 0, "Could not find AIG within given resource constraints, retry with different value for -C.\n" );
    }
    else
    {
        pNtkRes = Abc_NtkFindExact( pTruth, nVars, nFunc, nMaxDepth, fHasArrTimeProfile ? pArrTimeProfile : NULL, nBTLimit, nStartGates - 1, fVerbose );
        if ( pNtkRes )
        {
            Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
            Abc_FrameClearVerifStatus( pAbc );
        }
        else
            Abc_Print( 0, "Could not find network within given resource constraints, retry with different value for -C.\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: exact [-DSC <num>] [-A <list>] [-atvh] <truth1> <truth2> ...\n" );
    Abc_Print( -2, "\t           finds optimum networks using SAT-based exact synthesis for hex truth tables <truth1> <truth2> ...\n" );
    Abc_Print( -2, "\t-D <num>  : constrain maximum depth (if too low, algorithm may not terminate)\n" );
    Abc_Print( -2, "\t-A <list> : input arrival times (comma separated list)\n" );
    Abc_Print( -2, "\t-S <num>  : number of start gates in search [default = %d]\n", nStartGates );
    Abc_Print( -2, "\t-C <num>  : the limit on the number of conflicts; turn off with 0 [default = %d]\n", nBTLimit );
    Abc_Print( -2, "\t-a        : toggle create AIG [default = %s]\n", fMakeAIG ? "yes" : "no" );
    Abc_Print( -2, "\t-t        : run test suite\n" );
    Abc_Print( -2, "\t-v        : toggle verbose printout [default = %s]\n", fVerbose ? "yes" : "no" );
    Abc_Print( -2, "\t-h        : print the command usage\n" );
    Abc_Print( -2, "\t\n" );
    Abc_Print( -2, "\t            This command was contributed by Mathias Soeken from EPFL in July 2016.\n" );
    Abc_Print( -2, "\t            The author can be contacted as mathias.soeken at epfl.ch\n" );
    return 1;
}